

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O2

void __thiscall
VectorSUnitTest_range_for_loop_Test::~VectorSUnitTest_range_for_loop_Test
          (VectorSUnitTest_range_for_loop_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, range_for_loop)
{
    using vec_t = vector_s<size_t, 4>;
    {
        vec_t v{1u,2u,3u,4u};
        size_t count = 0;
        for (auto& e : v ) {
            ++count;
            EXPECT_EQ(count, e);
            e = count + 1u;
        }
        EXPECT_EQ(4u, count);
        EXPECT_EQ(2u, v[0]);
        EXPECT_EQ(3u, v[1]);
        EXPECT_EQ(4u, v[2]);
        EXPECT_EQ(5u, v[3]);
    }

    // const
    {
        const vec_t v{1u,2u,3u,4u};
        size_t count = 0;
        for (const auto& e : v ) {
            ++count;
            EXPECT_EQ(count, e);
        }
        EXPECT_EQ(4u, count);
    }
}